

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O2

void av1_nn_predict_avx2(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float fVar1;
  uint num_outputs;
  __m128 afVar2;
  undefined1 auVar3 [16];
  int num_inputs_to_process;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int num_inputs_to_process_00;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  float (*output_nodes) [128];
  long lVar13;
  float *pfVar14;
  int in;
  ulong uVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float (*local_4c8) [128];
  __m128 local_4a8;
  ulong local_490;
  float *local_488;
  ulong local_480;
  int local_478;
  int local_474;
  int *local_470;
  float (*local_468) [128];
  int *local_460;
  NN_CONFIG *local_458;
  float *local_450;
  float local_448 [2];
  float afStack_440 [2];
  float buf [2] [128];
  int iVar4;
  
  local_470 = &nn_config->num_outputs;
  local_460 = nn_config->num_hidden_nodes;
  uVar7 = 0;
  uVar15 = 0;
  uVar12 = (ulong)(uint)nn_config->num_inputs;
  local_478 = reduce_prec;
  local_468 = (float (*) [128])output;
  local_458 = nn_config;
  while ((long)uVar15 <= (long)local_458->num_hidden_layers) {
    uVar11 = (ulong)(uint)local_458->num_hidden_layers;
    pfVar10 = local_458->weights[uVar15];
    local_474 = (int)uVar7;
    output_nodes = buf + uVar7;
    if (uVar15 == uVar11) {
      output_nodes = local_468;
    }
    local_4c8 = (float (*) [128])local_458->bias[uVar15];
    piVar5 = local_460 + uVar15;
    if (uVar15 == uVar11) {
      piVar5 = local_470;
    }
    num_outputs = *piVar5;
    uVar7 = (ulong)num_outputs;
    num_inputs_to_process_00 = (int)uVar12;
    iVar4 = (int)((long)((ulong)(uint)(num_inputs_to_process_00 >> 0x1f) << 0x20 |
                        uVar12 & 0xffffffff) / 8);
    num_inputs_to_process = iVar4 * 8;
    uVar8 = num_inputs_to_process_00 + iVar4 * -8;
    local_490 = uVar7;
    if (uVar8 == 0) {
      nn_propagate_input_multiple_of_8
                (input_nodes,pfVar10,(float *)local_4c8,num_inputs_to_process_00,
                 num_inputs_to_process_00,uVar15 == uVar11,num_outputs,*output_nodes);
    }
    else {
      if (0xe < num_inputs_to_process_00 + 7U) {
        nn_propagate_input_multiple_of_8
                  (input_nodes,pfVar10,(float *)local_4c8,num_inputs_to_process,
                   num_inputs_to_process_00,uVar15 == uVar11,num_outputs,*output_nodes);
        local_4c8 = output_nodes;
      }
      lVar13 = (long)num_inputs_to_process_00;
      local_480 = uVar15;
      if ((num_outputs & 7) == 0 && (uVar8 & 3) == 0) {
        lVar6 = (long)num_inputs_to_process;
        pfVar10 = pfVar10 + lVar6;
        local_488 = (float *)(lVar13 << 5);
        local_450 = *(float (*) [128])input_nodes + lVar6;
        for (uVar12 = 0; uVar15 = local_480, (long)uVar12 < (long)(int)num_outputs;
            uVar12 = uVar12 + 8) {
          local_4a8 = *(__m128 *)(*local_4c8 + uVar12 + 4);
          local_448 = *(float (*) [2])(*local_4c8 + uVar12);
          afStack_440 = *(float (*) [2])(*local_4c8 + uVar12 + 2);
          pfVar9 = pfVar10;
          pfVar14 = local_450;
          for (lVar16 = lVar6; lVar16 < lVar13; lVar16 = lVar16 + 4) {
            av1_nn_propagate_4to8_sse3
                      (pfVar14,pfVar9,&local_4a8,(__m128 *)local_448,num_inputs_to_process_00);
            pfVar9 = pfVar9 + 4;
            pfVar14 = pfVar14 + 4;
          }
          auVar3._8_4_ = afStack_440[0];
          auVar3._12_4_ = afStack_440[1];
          auVar3._0_4_ = local_448[0];
          auVar3._4_4_ = local_448[1];
          afVar2 = local_4a8;
          if (local_480 != uVar11) {
            afVar2 = (__m128)vmaxps_avx((undefined1  [16])local_4a8,ZEXT816(0) << 0x40);
            auVar3 = vmaxps_avx(auVar3,ZEXT816(0) << 0x40);
          }
          *(__m128 *)(*output_nodes + (uVar12 | 4)) = afVar2;
          *(undefined1 (*) [16])(*output_nodes + uVar12) = auVar3;
          pfVar10 = (float *)((long)pfVar10 + (long)local_488);
        }
      }
      else {
        lVar6 = (long)num_inputs_to_process;
        if (((uVar8 | num_outputs) & 3) == 0) {
          pfVar10 = pfVar10 + lVar6;
          local_488 = *(float (*) [128])input_nodes + lVar6;
          for (lVar16 = 0; uVar15 = local_480, lVar16 < (int)num_outputs; lVar16 = lVar16 + 4) {
            local_4a8 = *(__m128 *)(*local_4c8 + lVar16);
            pfVar9 = pfVar10;
            pfVar14 = local_488;
            for (lVar17 = lVar6; lVar17 < lVar13; lVar17 = lVar17 + 4) {
              av1_nn_propagate_4to4_sse3(pfVar14,pfVar9,&local_4a8,num_inputs_to_process_00);
              pfVar9 = pfVar9 + 4;
              pfVar14 = pfVar14 + 4;
            }
            afVar2 = local_4a8;
            if (local_480 != uVar11) {
              afVar2 = (__m128)vmaxps_avx((undefined1  [16])local_4a8,_DAT_00430080);
            }
            *(__m128 *)(*output_nodes + lVar16) = afVar2;
            pfVar10 = pfVar10 + lVar13 * 4;
          }
        }
        else {
          uVar12 = 0;
          if (0 < (int)num_outputs) {
            uVar12 = uVar7;
          }
          if ((uVar8 & 3) == 0) {
            pfVar10 = pfVar10 + lVar6;
            for (uVar7 = 0; uVar15 = local_480, uVar7 != uVar12; uVar7 = uVar7 + 1) {
              fVar1 = (*local_4c8)[uVar7];
              local_4a8[1] = fVar1;
              local_4a8[0] = fVar1;
              local_4a8[2] = fVar1;
              local_4a8[3] = fVar1;
              pfVar9 = *(float (*) [128])input_nodes + lVar6;
              pfVar14 = pfVar10;
              for (lVar16 = lVar6; lVar16 < lVar13; lVar16 = lVar16 + 4) {
                av1_nn_propagate_4to1_sse3(pfVar9,pfVar14,&local_4a8);
                pfVar14 = pfVar14 + 4;
                pfVar9 = pfVar9 + 4;
              }
              afVar2 = local_4a8;
              if (local_480 != uVar11) {
                afVar2 = (__m128)vmaxps_avx((undefined1  [16])local_4a8,_DAT_00430080);
              }
              (*output_nodes)[uVar7] = afVar2[0];
              pfVar10 = pfVar10 + lVar13;
            }
          }
          else {
            for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
              fVar1 = (*local_4c8)[uVar7];
              auVar18._4_4_ = fVar1;
              auVar18._0_4_ = fVar1;
              auVar18._8_4_ = fVar1;
              auVar18._12_4_ = fVar1;
              for (lVar16 = lVar6; lVar16 < lVar13; lVar16 = lVar16 + 1) {
                fVar1 = (*(float (*) [128])input_nodes)[lVar16] * pfVar10[lVar16];
                auVar19._0_4_ = auVar18._0_4_ + fVar1;
                auVar19._4_4_ = auVar18._4_4_ + fVar1;
                auVar19._8_4_ = auVar18._8_4_ + fVar1;
                auVar19._12_4_ = auVar18._12_4_ + fVar1;
                auVar18 = auVar19;
              }
              if (uVar15 != uVar11) {
                auVar18 = vmaxps_avx(auVar18,_DAT_00430080);
              }
              (*output_nodes)[uVar7] = auVar18._0_4_;
              pfVar10 = pfVar10 + lVar13;
            }
          }
        }
      }
    }
    uVar7 = (ulong)(1 - local_474);
    uVar15 = uVar15 + 1;
    uVar12 = local_490;
    input_nodes = *output_nodes;
  }
  if (local_478 != 0) {
    av1_nn_output_prec_reduce(*local_468,*local_470);
  }
  return;
}

Assistant:

void av1_nn_predict_avx2(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;
  assert(num_inputs > 0 && num_inputs <= NN_MAX_NODES_PER_LAYER);

  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool is_output_layer = layer == nn_config->num_hidden_layers;
    float *const output_nodes = is_output_layer ? output : &buf[buf_index][0];
    const int num_outputs = is_output_layer
                                ? nn_config->num_outputs
                                : nn_config->num_hidden_nodes[layer];
    assert(num_outputs > 0 && num_outputs <= NN_MAX_NODES_PER_LAYER);

    // Process input multiple of 8 using AVX2 intrinsic.
    if (num_inputs % 8 == 0) {
      nn_propagate_input_multiple_of_8(input_nodes, layer_weights, layer_bias,
                                       num_inputs, num_inputs, is_output_layer,
                                       num_outputs, output_nodes);
    } else {
      // When number of inputs is not multiple of 8, use hybrid approach of AVX2
      // and SSE3 based on the need.
      const int in_mul_8 = num_inputs / 8;
      const int num_inputs_to_process = in_mul_8 * 8;
      int bias_is_considered = 0;
      if (in_mul_8) {
        nn_propagate_input_multiple_of_8(
            input_nodes, layer_weights, layer_bias, num_inputs_to_process,
            num_inputs, is_output_layer, num_outputs, output_nodes);
        bias_is_considered = 1;
      }

      const float *out_temp = bias_is_considered ? output_nodes : layer_bias;
      const int input_remaining = num_inputs % 8;
      if (input_remaining % 4 == 0 && num_outputs % 8 == 0) {
        for (int out = 0; out < num_outputs; out += 8) {
          __m128 out_h = _mm_loadu_ps(&out_temp[out + 4]);
          __m128 out_l = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &out_h, &out_l, num_inputs);
          }
          if (!is_output_layer) {
            const __m128 zero = _mm_setzero_ps();
            out_h = _mm_max_ps(out_h, zero);
            out_l = _mm_max_ps(out_l, zero);
          }
          _mm_storeu_ps(&output_nodes[out + 4], out_h);
          _mm_storeu_ps(&output_nodes[out], out_l);
        }
      } else if (input_remaining % 4 == 0 && num_outputs % 4 == 0) {
        for (int out = 0; out < num_outputs; out += 4) {
          __m128 outputs = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs, num_inputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          _mm_storeu_ps(&output_nodes[out], outputs);
        }
      } else if (input_remaining % 4 == 0) {
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to1_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      } else {
        // Use SSE instructions for scalar operations to avoid the latency
        // of swapping between SIMD and FPU modes.
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in_node = in_mul_8 * 8; in_node < num_inputs; in_node++) {
            __m128 input = _mm_load1_ps(&input_nodes[in_node]);
            __m128 weight =
                _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
            outputs = _mm_add_ps(outputs, _mm_mul_ps(input, weight));
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      }
    }
    // Before processing the next layer, treat the output of current layer as
    // input to next layer.
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}